

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

LogicalType *
duckdb::LogicalType::ForceMaxLogicalType
          (LogicalType *__return_storage_ptr__,LogicalType *left,LogicalType *right)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  idx_t iVar4;
  idx_t iVar5;
  LogicalType result;
  LogicalType LStack_38;
  
  LogicalType(&LStack_38);
  bVar3 = TryGetMaxLogicalTypeInternal<duckdb::ForceGetTypeOperation>(left,right,&LStack_38);
  if (bVar3) {
    LogicalType(__return_storage_ptr__,&LStack_38);
  }
  else {
    uVar1._0_1_ = left->id_;
    uVar1._1_1_ = left->physical_type_;
    uVar1._2_2_ = *(undefined2 *)&left->field_0x2;
    iVar4 = GetLogicalTypeScore((LogicalType *)(ulong)uVar1);
    uVar2._0_1_ = right->id_;
    uVar2._1_1_ = right->physical_type_;
    uVar2._2_2_ = *(undefined2 *)&right->field_0x2;
    iVar5 = GetLogicalTypeScore((LogicalType *)(ulong)uVar2);
    if ((uint)iVar4 < (uint)iVar5) {
      left = right;
    }
    LogicalType(__return_storage_ptr__,left);
  }
  ~LogicalType(&LStack_38);
  return __return_storage_ptr__;
}

Assistant:

LogicalType LogicalType::ForceMaxLogicalType(const LogicalType &left, const LogicalType &right) {
	LogicalType result;
	if (TryGetMaxLogicalTypeInternal<ForceGetTypeOperation>(left, right, result)) {
		return result;
	}
	// we prefer the type with the highest score
	auto left_score = GetLogicalTypeScore(left);
	auto right_score = GetLogicalTypeScore(right);
	if (left_score < right_score) {
		return right;
	} else {
		return left;
	}
}